

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

void __thiscall ON_4dRect::NormalizeRect(ON_4dRect *this)

{
  double dVar1;
  
  dVar1 = this->left;
  if (this->right < dVar1) {
    this->left = this->right;
    this->right = dVar1;
  }
  dVar1 = this->top;
  if (this->bottom < dVar1) {
    this->top = this->bottom;
    this->bottom = dVar1;
  }
  return;
}

Assistant:

void ON_4dRect::NormalizeRect()
{
	double nTemp;
	if (left > right)
	{
		nTemp = left;
		left = right;
		right = nTemp;
	}
	if (top > bottom)
	{
		nTemp = top;
		top = bottom;
		bottom = nTemp;
	}
}